

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O0

int archive_read_support_filter_bzip2(archive *_a)

{
  int iVar1;
  archive_read *a;
  archive *_a_local;
  
  iVar1 = __archive_read_register_bidder
                    ((archive_read *)_a,(void *)0x0,"bzip2",&bzip2_bidder_vtable);
  if (iVar1 == 0) {
    archive_set_error(_a,-1,"Using external bzip2 program");
    _a_local._4_4_ = -0x14;
  }
  else {
    _a_local._4_4_ = -0x1e;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_filter_bzip2(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;

	if (__archive_read_register_bidder(a, NULL, "bzip2",
				&bzip2_bidder_vtable) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external bzip2 program");
	return (ARCHIVE_WARN);
#endif
}